

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O0

void __thiscall arangodb::velocypack::Builder::openCompoundValue(Builder *this,uint8_t type)

{
  bool bVar1;
  reference pvVar2;
  Exception *this_00;
  Builder *in_RDI;
  ValueLength to;
  ExceptionType in_stack_ffffffffffffffbc;
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  *in_stack_ffffffffffffffc0;
  uint8_t in_stack_ffffffffffffffdf;
  Builder *in_stack_ffffffffffffffe0;
  
  bVar1 = std::
          vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
          ::empty((vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
                   *)in_RDI);
  if (bVar1) {
    addCompoundValue(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf);
  }
  else if ((in_RDI->_keyWritten & 1U) == 0) {
    pvVar2 = std::
             vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
             ::back(in_stack_ffffffffffffffc0);
    bVar1 = false;
    if (in_RDI->_start[pvVar2->startPos] != '\x06') {
      bVar1 = in_RDI->_start[pvVar2->startPos] != '\x13';
    }
    if (bVar1) {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      Exception::Exception(this_00,in_stack_ffffffffffffffbc);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
    reportAdd(in_RDI);
    addCompoundValue(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf);
  }
  else {
    in_RDI->_keyWritten = false;
    addCompoundValue(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf);
  }
  return;
}

Assistant:

void openCompoundValue(uint8_t type) {
    if (_stack.empty()) {
      addCompoundValue(type);
    } else if (_keyWritten) {
      _keyWritten = false;
      addCompoundValue(type);
    } else {
      ValueLength const to = _stack.back().startPos;
      if (VELOCYPACK_UNLIKELY(_start[to] != 0x06 && _start[to] != 0x13)) {
        throw Exception(Exception::BuilderNeedOpenArray);
      }
      reportAdd();
      try {
        addCompoundValue(type);
      } catch (...) {
        cleanupAdd();
        throw;
      }
    }
  }